

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substitute.cc
# Opt level: O3

void google::protobuf::strings::SubstituteAndAppend
               (string *output,char *format,SubstituteArg *arg0,SubstituteArg *arg1,
               SubstituteArg *arg2,SubstituteArg *arg3,SubstituteArg *arg4,SubstituteArg *arg5,
               SubstituteArg *arg6,SubstituteArg *arg7,SubstituteArg *arg8,SubstituteArg *arg9)

{
  byte bVar1;
  size_type sVar2;
  SubstituteArg *pSVar3;
  int iVar4;
  pointer pcVar5;
  LogMessage *pLVar6;
  int iVar7;
  long lVar8;
  char cVar9;
  uint value;
  char *__dest;
  SubstituteArg *args_array [11];
  LogFinisher local_102;
  allocator<char> local_101;
  string local_100;
  string local_e0;
  LogMessage local_c0;
  SubstituteArg *local_88 [5];
  SubstituteArg *pSStack_60;
  SubstituteArg *local_58;
  SubstituteArg *pSStack_50;
  SubstituteArg *local_48;
  SubstituteArg *pSStack_40;
  undefined8 local_38;
  
  local_88[0] = arg0;
  local_88[1] = arg1;
  local_88[2] = arg2;
  local_88[3] = arg3;
  local_88[4] = arg4;
  pSStack_60 = arg5;
  local_58 = arg6;
  pSStack_50 = arg7;
  local_48 = arg8;
  pSStack_40 = arg9;
  local_38 = 0;
  cVar9 = *format;
  if (cVar9 == '\0') {
    return;
  }
  iVar4 = 0;
  lVar8 = 0;
  do {
    iVar7 = (int)lVar8;
    if (cVar9 == '$') {
      bVar1 = format[(long)iVar7 + 1];
      iVar7 = iVar7 + 1;
      if (9 < (byte)(bVar1 - 0x30)) {
        if (bVar1 == 0x24) goto LAB_0032e9f3;
        internal::LogMessage::LogMessage
                  (&local_c0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/substitute.cc"
                   ,0x61);
        pLVar6 = internal::LogMessage::operator<<
                           (&local_c0,"Invalid strings::Substitute() format string: \"");
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,format,&local_101);
        CEscape(&local_100,&local_e0);
        pLVar6 = internal::LogMessage::operator<<(pLVar6,&local_100);
        pLVar6 = internal::LogMessage::operator<<(pLVar6,"\".");
        internal::LogFinisher::operator=(&local_102,pLVar6);
        goto LAB_0032eb78;
      }
      value = bVar1 - 0x30;
      if (local_88[value]->size_ == -1) {
        internal::LogMessage::LogMessage
                  (&local_c0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/substitute.cc"
                   ,0x54);
        pLVar6 = internal::LogMessage::operator<<
                           (&local_c0,"strings::Substitute format string invalid: asked for \"$");
        pLVar6 = internal::LogMessage::operator<<(pLVar6,value);
        pLVar6 = internal::LogMessage::operator<<(pLVar6,"\", but only ");
        lVar8 = 0;
        goto LAB_0032eafd;
      }
      iVar4 = iVar4 + local_88[value]->size_;
    }
    else {
LAB_0032e9f3:
      iVar4 = iVar4 + 1;
    }
    cVar9 = format[(long)iVar7 + 1];
    lVar8 = (long)iVar7 + 1;
  } while (cVar9 != '\0');
  if (iVar4 == 0) {
    return;
  }
  sVar2 = output->_M_string_length;
  iVar7 = 0;
  std::__cxx11::string::resize((ulong)output,(char)iVar4 + (char)sVar2);
  if (output->_M_string_length == 0) {
    pcVar5 = (pointer)0x0;
  }
  else {
    pcVar5 = (output->_M_dataplus)._M_p;
  }
  __dest = pcVar5 + (int)sVar2;
  do {
    cVar9 = format[iVar7];
    if (cVar9 == '$') {
      bVar1 = format[(long)iVar7 + 1];
      if ((byte)(bVar1 - 0x30) < 10) {
        pSVar3 = local_88[bVar1 & 0xf];
        memcpy(__dest,pSVar3->text_,(long)pSVar3->size_);
        __dest = __dest + pSVar3->size_;
        iVar7 = iVar7 + 1;
      }
      else if (bVar1 == 0x24) {
        *__dest = '$';
        __dest = __dest + 1;
        iVar7 = iVar7 + 1;
      }
    }
    else {
      if (cVar9 == '\0') break;
      *__dest = cVar9;
      __dest = __dest + 1;
    }
    iVar7 = iVar7 + 1;
  } while( true );
  if ((long)__dest - (long)(output->_M_dataplus)._M_p == output->_M_string_length) {
    return;
  }
  internal::LogMessage::LogMessage
            (&local_c0,LOGLEVEL_DFATAL,
             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/substitute.cc"
             ,0x83);
  pLVar6 = internal::LogMessage::operator<<
                     (&local_c0,"CHECK failed: (target - output->data()) == (output->size()): ");
  internal::LogFinisher::operator=((LogFinisher *)&local_100,pLVar6);
  goto LAB_0032ec61;
  while( true ) {
    arg0 = local_88[lVar8 + 1];
    lVar8 = lVar8 + 1;
    if (arg0 == (SubstituteArg *)0x0) break;
LAB_0032eafd:
    if (arg0->size_ == -1) break;
  }
  pLVar6 = internal::LogMessage::operator<<(pLVar6,(int)lVar8);
  pLVar6 = internal::LogMessage::operator<<(pLVar6," args were given.  Full format string was: \"");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,format,&local_101);
  CEscape(&local_100,&local_e0);
  pLVar6 = internal::LogMessage::operator<<(pLVar6,&local_100);
  pLVar6 = internal::LogMessage::operator<<(pLVar6,"\".");
  internal::LogFinisher::operator=(&local_102,pLVar6);
LAB_0032eb78:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
LAB_0032ec61:
  internal::LogMessage::~LogMessage(&local_c0);
  return;
}

Assistant:

void SubstituteAndAppend(
    string* output, const char* format,
    const SubstituteArg& arg0, const SubstituteArg& arg1,
    const SubstituteArg& arg2, const SubstituteArg& arg3,
    const SubstituteArg& arg4, const SubstituteArg& arg5,
    const SubstituteArg& arg6, const SubstituteArg& arg7,
    const SubstituteArg& arg8, const SubstituteArg& arg9) {
  const SubstituteArg* const args_array[] = {
    &arg0, &arg1, &arg2, &arg3, &arg4, &arg5, &arg6, &arg7, &arg8, &arg9, NULL
  };

  // Determine total size needed.
  int size = 0;
  for (int i = 0; format[i] != '\0'; i++) {
    if (format[i] == '$') {
      if (ascii_isdigit(format[i+1])) {
        int index = format[i+1] - '0';
        if (args_array[index]->size() == -1) {
          GOOGLE_LOG(DFATAL)
            << "strings::Substitute format string invalid: asked for \"$"
            << index << "\", but only " << CountSubstituteArgs(args_array)
            << " args were given.  Full format string was: \""
            << CEscape(format) << "\".";
          return;
        }
        size += args_array[index]->size();
        ++i;  // Skip next char.
      } else if (format[i+1] == '$') {
        ++size;
        ++i;  // Skip next char.
      } else {
        GOOGLE_LOG(DFATAL)
          << "Invalid strings::Substitute() format string: \""
          << CEscape(format) << "\".";
        return;
      }
    } else {
      ++size;
    }
  }

  if (size == 0) return;

  // Build the string.
  int original_size = output->size();
  STLStringResizeUninitialized(output, original_size + size);
  char* target = string_as_array(output) + original_size;
  for (int i = 0; format[i] != '\0'; i++) {
    if (format[i] == '$') {
      if (ascii_isdigit(format[i+1])) {
        unsigned int index = format[i+1] - '0';
        assert(index < 10);
        const SubstituteArg* src = args_array[index];
        memcpy(target, src->data(), src->size());
        target += src->size();
        ++i;  // Skip next char.
      } else if (format[i+1] == '$') {
        *target++ = '$';
        ++i;  // Skip next char.
      }
    } else {
      *target++ = format[i];
    }
  }

  GOOGLE_DCHECK_EQ(target - output->data(), output->size());
}